

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# multiheadattention.cpp
# Opt level: O1

int __thiscall
ncnn::MultiHeadAttention::forward
          (MultiHeadAttention *this,vector<ncnn::Mat,_std::allocator<ncnn::Mat>_> *bottom_blobs,
          vector<ncnn::Mat,_std::allocator<ncnn::Mat>_> *top_blobs,Option *opt)

{
  uint uVar1;
  int iVar2;
  int iVar3;
  pointer pMVar4;
  Mat *this_00;
  size_t sVar5;
  long lVar6;
  int *piVar7;
  int j_1;
  long lVar8;
  void *pvVar9;
  long lVar10;
  ulong uVar11;
  int j_2;
  int iVar12;
  long lVar13;
  long lVar14;
  long lVar15;
  long lVar16;
  int j;
  long lVar17;
  void *pvVar18;
  ulong uVar19;
  long lVar20;
  long lVar21;
  ulong uVar22;
  long lVar23;
  void *pvVar24;
  void *pvVar25;
  ulong uVar26;
  long lVar27;
  void *pvVar28;
  bool bVar29;
  float sum;
  float fVar30;
  float fVar31;
  float fVar32;
  long local_2b0;
  long local_2a8;
  void *local_290;
  void *local_288;
  void *local_280;
  void *local_258;
  void *local_250;
  Mat local_218;
  Mat local_1c8;
  Mat local_178;
  Mat local_128;
  Mat *local_d8;
  void *local_d0;
  long local_c8;
  void *local_c0;
  void *local_b8;
  void *local_b0;
  void *local_a8;
  long local_a0;
  long local_98;
  long local_90;
  long local_88;
  long local_80;
  Mat local_78;
  
  pMVar4 = (bottom_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>)._M_impl.
           super__Vector_impl_data._M_start;
  bVar29 = (long)(bottom_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>)._M_impl.
                 super__Vector_impl_data._M_finish - (long)pMVar4 == 0x48;
  local_80 = 0x48;
  if (bVar29) {
    local_80 = 0;
  }
  local_88 = 0x90;
  if (bVar29) {
    local_88 = 0;
  }
  uVar1 = pMVar4->h;
  uVar11 = (ulong)uVar1;
  uVar22 = (long)this->embed_dim / (long)this->num_head;
  this_00 = (top_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>)._M_impl.
            super__Vector_impl_data._M_start;
  Mat::create(this_00,this->embed_dim,uVar1,4,opt->blob_allocator);
  iVar12 = -1;
  if ((this_00->data != (void *)0x0) && ((long)this_00->c * this_00->cstep != 0)) {
    local_218.cstep = 0;
    local_218.data = (void *)0x0;
    local_218.refcount._0_4_ = 0;
    local_218.refcount._4_4_ = 0;
    local_218.elemsize._0_4_ = 0;
    local_218.elemsize._4_4_ = 0;
    local_218.elempack = 0;
    local_218.allocator = (Allocator *)0x0;
    local_218.dims = 0;
    local_218.w = 0;
    local_218.h = 0;
    local_218.d = 0;
    local_218.c = 0;
    iVar12 = (int)uVar22;
    local_d8 = this_00;
    Mat::create(&local_218,iVar12,uVar1,this->num_head,4,opt->workspace_allocator);
    local_128.cstep = 0;
    local_128.data = (void *)0x0;
    local_128.refcount._0_4_ = 0;
    local_128.refcount._4_4_ = 0;
    local_128.elemsize._0_4_ = 0;
    local_128.elemsize._4_4_ = 0;
    local_128.elempack = 0;
    local_128.allocator = (Allocator *)0x0;
    local_128.dims = 0;
    local_128.w = 0;
    local_128.h = 0;
    local_128.d = 0;
    local_128.c = 0;
    Mat::create(&local_128,iVar12,uVar1,this->num_head,4,opt->workspace_allocator);
    local_178.cstep = 0;
    local_178.data = (void *)0x0;
    local_178.refcount._0_4_ = 0;
    local_178.refcount._4_4_ = 0;
    local_178.elemsize._0_4_ = 0;
    local_178.elemsize._4_4_ = 0;
    local_178.elempack = 0;
    local_178.allocator = (Allocator *)0x0;
    local_178.dims = 0;
    local_178.w = 0;
    local_178.h = 0;
    local_178.d = 0;
    local_178.c = 0;
    Mat::create(&local_178,uVar1,iVar12,this->num_head,4,opt->workspace_allocator);
    local_1c8.cstep = 0;
    local_1c8.data = (void *)0x0;
    local_1c8.refcount._0_4_ = 0;
    local_1c8.refcount._4_4_ = 0;
    local_1c8.elemsize._0_4_ = 0;
    local_1c8.elemsize._4_4_ = 0;
    local_1c8.elempack = 0;
    local_1c8.allocator = (Allocator *)0x0;
    local_1c8.dims = 0;
    local_1c8.w = 0;
    local_1c8.h = 0;
    local_1c8.d = 0;
    local_1c8.c = 0;
    Mat::create(&local_1c8,uVar1,uVar1,this->num_head,4,opt->workspace_allocator);
    local_78.cstep = 0;
    local_78.data = (void *)0x0;
    local_78.refcount._0_4_ = 0;
    local_78.refcount._4_4_ = 0;
    local_78.elemsize._0_4_ = 0;
    local_78.elemsize._4_4_ = 0;
    local_78.elempack = 0;
    local_78.allocator = (Allocator *)0x0;
    local_78.dims = 0;
    local_78.w = 0;
    local_78.h = 0;
    local_78.d = 0;
    local_78.c = 0;
    Mat::create(&local_78,iVar12,this->num_head,uVar1,4,opt->workspace_allocator);
    local_90 = (long)this->num_head;
    if (0 < local_90) {
      lVar10 = local_218.cstep * CONCAT44(local_218.elemsize._4_4_,(undefined4)local_218.elemsize);
      lVar20 = (long)local_218.w * CONCAT44(local_218.elemsize._4_4_,(undefined4)local_218.elemsize)
      ;
      lVar15 = local_128.cstep * CONCAT44(local_128.elemsize._4_4_,(undefined4)local_128.elemsize);
      lVar27 = (long)local_128.w * CONCAT44(local_128.elemsize._4_4_,(undefined4)local_128.elemsize)
      ;
      lVar16 = local_178.cstep * CONCAT44(local_178.elemsize._4_4_,(undefined4)local_178.elemsize);
      lVar21 = (long)local_178.w * CONCAT44(local_178.elemsize._4_4_,(undefined4)local_178.elemsize)
      ;
      lVar17 = local_1c8.cstep * CONCAT44(local_1c8.elemsize._4_4_,(undefined4)local_1c8.elemsize);
      lVar23 = (long)local_1c8.w * CONCAT44(local_1c8.elemsize._4_4_,(undefined4)local_1c8.elemsize)
      ;
      local_98 = local_78.cstep * CONCAT44(local_78.elemsize._4_4_,(undefined4)local_78.elemsize);
      local_c8 = (long)local_78.w * CONCAT44(local_78.elemsize._4_4_,(undefined4)local_78.elemsize);
      local_d0 = local_78.data;
      lVar8 = (long)iVar12;
      uVar22 = uVar22 & 0xffffffff;
      local_a0 = lVar8 * 4;
      local_2a8 = 0;
      local_250 = local_1c8.data;
      local_b8 = local_178.data;
      local_280 = local_178.data;
      local_c0 = local_1c8.data;
      local_258 = local_1c8.data;
      local_a8 = local_218.data;
      local_290 = local_218.data;
      local_b0 = local_128.data;
      local_288 = local_128.data;
      local_2b0 = 0;
      do {
        if (0 < (int)uVar1) {
          iVar2 = this->embed_dim;
          pvVar9 = (this->q_bias_data).data;
          pvVar18 = (this->q_weight_data).data;
          uVar19 = 0;
          do {
            if (0 < iVar12) {
              iVar3 = pMVar4->w;
              sVar5 = pMVar4->elemsize;
              pvVar25 = pMVar4->data;
              uVar26 = 0;
              pvVar24 = (void *)(local_2a8 * iVar2 + (long)pvVar18);
              do {
                fVar30 = *(float *)((long)pvVar9 + (local_2b0 * lVar8 + uVar26) * 4);
                if (0 < iVar2) {
                  lVar13 = 0;
                  do {
                    fVar30 = fVar30 + *(float *)((long)pvVar24 + lVar13 * 4) *
                                      *(float *)((long)pvVar25 +
                                                lVar13 * 4 + sVar5 * uVar19 * (long)iVar3);
                    lVar13 = lVar13 + 1;
                  } while (iVar2 != (int)lVar13);
                }
                *(float *)((long)local_a8 + uVar26 * 4 + lVar20 * uVar19 + lVar10 * local_2b0) =
                     fVar30 * (1.0 / SQRT((float)iVar12));
                uVar26 = uVar26 + 1;
                pvVar24 = (void *)((long)pvVar24 + (long)iVar2 * 4);
              } while (uVar26 != uVar22);
            }
            uVar19 = uVar19 + 1;
          } while (uVar19 != uVar11);
        }
        if (0 < (int)uVar1) {
          iVar2 = this->embed_dim;
          pvVar9 = (this->k_bias_data).data;
          pvVar18 = (this->k_weight_data).data;
          uVar19 = 0;
          do {
            if (0 < iVar12) {
              iVar3 = *(int *)((long)&pMVar4->w + local_80);
              lVar13 = *(long *)((long)&pMVar4->elemsize + local_80);
              lVar6 = *(long *)((long)&pMVar4->data + local_80);
              uVar26 = 0;
              pvVar25 = (void *)(local_2a8 * iVar2 + (long)pvVar18);
              do {
                fVar30 = *(float *)((long)pvVar9 + (local_2b0 * lVar8 + uVar26) * 4);
                if (0 < iVar2) {
                  lVar14 = 0;
                  do {
                    fVar30 = fVar30 + *(float *)((long)pvVar25 + lVar14 * 4) *
                                      *(float *)(lVar13 * uVar19 * (long)iVar3 + lVar6 + lVar14 * 4)
                    ;
                    lVar14 = lVar14 + 1;
                  } while (iVar2 != (int)lVar14);
                }
                *(float *)((long)local_b0 + uVar26 * 4 + lVar27 * uVar19 + lVar15 * local_2b0) =
                     fVar30;
                uVar26 = uVar26 + 1;
                pvVar25 = (void *)((long)pvVar25 + (long)iVar2 * 4);
              } while (uVar26 != uVar22);
            }
            uVar19 = uVar19 + 1;
          } while (uVar19 != uVar11);
        }
        if (0 < iVar12) {
          iVar2 = this->embed_dim;
          pvVar9 = (this->v_bias_data).data;
          pvVar18 = (void *)(local_2a8 * iVar2 + (long)(this->v_weight_data).data);
          uVar19 = 0;
          do {
            if (0 < (int)uVar1) {
              lVar13 = *(long *)((long)&pMVar4->data + local_88);
              iVar3 = *(int *)((long)&pMVar4->w + local_88);
              lVar6 = *(long *)((long)&pMVar4->elemsize + local_88);
              uVar26 = 0;
              do {
                fVar30 = *(float *)((long)pvVar9 + (local_2b0 * lVar8 + uVar19) * 4);
                if (0 < iVar2) {
                  lVar14 = 0;
                  do {
                    fVar30 = fVar30 + *(float *)((long)pvVar18 + lVar14 * 4) *
                                      *(float *)(lVar13 + lVar14 * 4);
                    lVar14 = lVar14 + 1;
                  } while (iVar2 != (int)lVar14);
                }
                *(float *)((long)local_b8 + uVar26 * 4 + lVar21 * uVar19 + lVar16 * local_2b0) =
                     fVar30;
                uVar26 = uVar26 + 1;
                lVar13 = lVar13 + iVar3 * lVar6;
              } while (uVar26 != uVar11);
            }
            uVar19 = uVar19 + 1;
            pvVar18 = (void *)((long)pvVar18 + (long)iVar2 * 4);
          } while (uVar19 != uVar22);
        }
        if (0 < (int)uVar1) {
          uVar19 = 0;
          pvVar9 = local_290;
          do {
            uVar26 = 0;
            pvVar18 = local_288;
            do {
              fVar30 = 0.0;
              if (0 < iVar12) {
                lVar13 = 0;
                do {
                  fVar30 = fVar30 + *(float *)((long)pvVar18 + lVar13 * 4) *
                                    *(float *)((long)pvVar9 + lVar13 * 4);
                  lVar13 = lVar13 + 1;
                } while (iVar12 != (int)lVar13);
              }
              *(float *)((long)local_c0 + uVar26 * 4 + lVar23 * uVar19 + lVar17 * local_2b0) =
                   fVar30;
              uVar26 = uVar26 + 1;
              pvVar18 = (void *)((long)pvVar18 + lVar27);
            } while (uVar26 != uVar11);
            uVar19 = uVar19 + 1;
            pvVar9 = (void *)((long)pvVar9 + lVar20);
          } while (uVar19 != uVar11);
        }
        if (0 < (int)uVar1) {
          uVar19 = 0;
          pvVar9 = local_258;
          do {
            uVar26 = 0;
            fVar30 = -3.4028235e+38;
            do {
              fVar32 = *(float *)((long)pvVar9 + uVar26 * 4);
              if (fVar30 <= fVar32) {
                fVar30 = fVar32;
              }
              uVar26 = uVar26 + 1;
            } while (uVar11 != uVar26);
            fVar32 = 0.0;
            uVar26 = 0;
            do {
              fVar31 = expf(*(float *)((long)pvVar9 + uVar26 * 4) - fVar30);
              *(float *)((long)pvVar9 + uVar26 * 4) = fVar31;
              fVar32 = fVar32 + fVar31;
              uVar26 = uVar26 + 1;
            } while (uVar11 != uVar26);
            uVar26 = 0;
            do {
              *(float *)((long)pvVar9 + uVar26 * 4) =
                   *(float *)((long)pvVar9 + uVar26 * 4) * (1.0 / fVar32);
              uVar26 = uVar26 + 1;
            } while (uVar11 != uVar26);
            uVar19 = uVar19 + 1;
            pvVar9 = (void *)((long)pvVar9 + lVar23);
          } while (uVar19 != uVar11);
        }
        if (0 < (int)uVar1) {
          uVar19 = 0;
          pvVar9 = local_250;
          do {
            if (0 < iVar12) {
              uVar26 = 0;
              pvVar18 = local_280;
              do {
                fVar30 = 0.0;
                lVar13 = 0;
                do {
                  fVar30 = fVar30 + *(float *)((long)pvVar18 + lVar13 * 4) *
                                    *(float *)((long)pvVar9 + lVar13 * 4);
                  lVar13 = lVar13 + 1;
                } while (uVar1 != (uint)lVar13);
                *(float *)((long)local_d0 + uVar26 * 4 + local_98 * uVar19 + local_c8 * local_2b0) =
                     fVar30;
                uVar26 = uVar26 + 1;
                pvVar18 = (void *)((long)pvVar18 + lVar21);
              } while (uVar26 != uVar22);
            }
            uVar19 = uVar19 + 1;
            pvVar9 = (void *)((long)pvVar9 + lVar23);
          } while (uVar19 != uVar11);
        }
        local_2b0 = local_2b0 + 1;
        local_2a8 = local_2a8 + local_a0;
        local_288 = (void *)((long)local_288 + lVar15);
        local_290 = (void *)((long)local_290 + lVar10);
        local_258 = (void *)((long)local_258 + lVar17);
        local_280 = (void *)((long)local_280 + lVar16);
        local_250 = (void *)((long)local_250 + lVar17);
      } while (local_2b0 != local_90);
    }
    if (0 < (int)uVar1) {
      pvVar9 = local_d8->data;
      iVar12 = local_d8->w;
      sVar5 = local_d8->elemsize;
      uVar1 = this->embed_dim;
      pvVar18 = (this->out_weight_data).data;
      pvVar25 = (this->out_bias_data).data;
      uVar22 = 0;
      pvVar24 = local_78.data;
      do {
        if (0 < (int)uVar1) {
          uVar19 = 0;
          pvVar28 = pvVar18;
          do {
            fVar30 = *(float *)((long)pvVar25 + uVar19 * 4);
            if (0 < (int)uVar1) {
              lVar8 = 0;
              do {
                fVar30 = fVar30 + *(float *)((long)pvVar28 + lVar8 * 4) *
                                  *(float *)((long)pvVar24 + lVar8 * 4);
                lVar8 = lVar8 + 1;
              } while (uVar1 != (uint)lVar8);
            }
            *(float *)((long)pvVar9 + uVar19 * 4 + (long)iVar12 * sVar5 * uVar22) = fVar30;
            uVar19 = uVar19 + 1;
            pvVar28 = (void *)((long)pvVar28 + (long)(int)uVar1 * 4);
          } while (uVar19 != uVar1);
        }
        uVar22 = uVar22 + 1;
        pvVar24 = (void *)((long)pvVar24 +
                          local_78.cstep *
                          CONCAT44(local_78.elemsize._4_4_,(undefined4)local_78.elemsize));
      } while (uVar22 != uVar11);
    }
    piVar7 = (int *)CONCAT44(local_78.refcount._4_4_,local_78.refcount._0_4_);
    if (piVar7 != (int *)0x0) {
      LOCK();
      *piVar7 = *piVar7 + -1;
      UNLOCK();
      if (*piVar7 == 0) {
        if (local_78.allocator == (Allocator *)0x0) {
          if (local_78.data != (void *)0x0) {
            free(local_78.data);
          }
        }
        else {
          (*(local_78.allocator)->_vptr_Allocator[3])();
        }
      }
    }
    local_78.cstep = 0;
    local_78.data = (void *)0x0;
    local_78.refcount._0_4_ = 0;
    local_78.refcount._4_4_ = 0;
    local_78.elemsize._0_4_ = 0;
    local_78.elemsize._4_4_ = 0;
    local_78.elempack = 0;
    local_78.dims = 0;
    local_78.w = 0;
    local_78.h = 0;
    local_78.d = 0;
    local_78.c = 0;
    piVar7 = (int *)CONCAT44(local_1c8.refcount._4_4_,local_1c8.refcount._0_4_);
    if (piVar7 != (int *)0x0) {
      LOCK();
      *piVar7 = *piVar7 + -1;
      UNLOCK();
      if (*piVar7 == 0) {
        if (local_1c8.allocator == (Allocator *)0x0) {
          if (local_1c8.data != (void *)0x0) {
            free(local_1c8.data);
          }
        }
        else {
          (*(local_1c8.allocator)->_vptr_Allocator[3])();
        }
      }
    }
    local_1c8.cstep = 0;
    local_1c8.data = (void *)0x0;
    local_1c8.refcount._0_4_ = 0;
    local_1c8.refcount._4_4_ = 0;
    local_1c8.elemsize._0_4_ = 0;
    local_1c8.elemsize._4_4_ = 0;
    local_1c8.elempack = 0;
    local_1c8.dims = 0;
    local_1c8.w = 0;
    local_1c8.h = 0;
    local_1c8.d = 0;
    local_1c8.c = 0;
    piVar7 = (int *)CONCAT44(local_178.refcount._4_4_,local_178.refcount._0_4_);
    if (piVar7 != (int *)0x0) {
      LOCK();
      *piVar7 = *piVar7 + -1;
      UNLOCK();
      if (*piVar7 == 0) {
        if (local_178.allocator == (Allocator *)0x0) {
          if (local_178.data != (void *)0x0) {
            free(local_178.data);
          }
        }
        else {
          (*(local_178.allocator)->_vptr_Allocator[3])();
        }
      }
    }
    local_178.cstep = 0;
    local_178.data = (void *)0x0;
    local_178.refcount._0_4_ = 0;
    local_178.refcount._4_4_ = 0;
    local_178.elemsize._0_4_ = 0;
    local_178.elemsize._4_4_ = 0;
    local_178.elempack = 0;
    local_178.dims = 0;
    local_178.w = 0;
    local_178.h = 0;
    local_178.d = 0;
    local_178.c = 0;
    piVar7 = (int *)CONCAT44(local_128.refcount._4_4_,local_128.refcount._0_4_);
    if (piVar7 != (int *)0x0) {
      LOCK();
      *piVar7 = *piVar7 + -1;
      UNLOCK();
      if (*piVar7 == 0) {
        if (local_128.allocator == (Allocator *)0x0) {
          if (local_128.data != (void *)0x0) {
            free(local_128.data);
          }
        }
        else {
          (*(local_128.allocator)->_vptr_Allocator[3])();
        }
      }
    }
    local_128.cstep = 0;
    local_128.data = (void *)0x0;
    local_128.refcount._0_4_ = 0;
    local_128.refcount._4_4_ = 0;
    local_128.elemsize._0_4_ = 0;
    local_128.elemsize._4_4_ = 0;
    local_128.elempack = 0;
    local_128.dims = 0;
    local_128.w = 0;
    local_128.h = 0;
    local_128.d = 0;
    local_128.c = 0;
    piVar7 = (int *)CONCAT44(local_218.refcount._4_4_,local_218.refcount._0_4_);
    if (piVar7 != (int *)0x0) {
      LOCK();
      *piVar7 = *piVar7 + -1;
      UNLOCK();
      if (*piVar7 == 0) {
        if (local_218.allocator == (Allocator *)0x0) {
          if (local_218.data != (void *)0x0) {
            free(local_218.data);
          }
        }
        else {
          (*(local_218.allocator)->_vptr_Allocator[3])();
        }
      }
    }
    iVar12 = 0;
  }
  return iVar12;
}

Assistant:

int MultiHeadAttention::forward(const std::vector<Mat>& bottom_blobs, std::vector<Mat>& top_blobs, const Option& opt) const
{
    const Mat& q_blob = bottom_blobs[0];
    const Mat& k_blob = bottom_blobs.size() == 1 ? q_blob : bottom_blobs[1];
    const Mat& v_blob = bottom_blobs.size() == 1 ? q_blob : bottom_blobs[2];

    const int seqlen = q_blob.h;
    const int embed_dim_per_head = embed_dim / num_head;

    Mat& top_blob = top_blobs[0];
    top_blob.create(embed_dim, seqlen, 4u, opt.blob_allocator);
    if (top_blob.empty())
        return -1;

    Mat xq(embed_dim_per_head, seqlen, num_head, 4u, opt.workspace_allocator);
    Mat xk(embed_dim_per_head, seqlen, num_head, 4u, opt.workspace_allocator);
    Mat xv(seqlen, embed_dim_per_head, num_head, 4u, opt.workspace_allocator);

    Mat xqk(seqlen, seqlen, num_head, 4u, opt.workspace_allocator);

    Mat xqkv(embed_dim_per_head, num_head, seqlen, 4u, opt.workspace_allocator);

    const float inv_sqrt_embed_dim_per_head = 1.f / sqrt(embed_dim_per_head);

    #pragma omp parallel for num_threads(opt.num_threads)
    for (int q = 0; q < num_head; q++)
    {
        // xq = affine(q) * inv_sqrt_embed_dim_per_head
        {
            Mat outm = xq.channel(q);

            for (int i = 0; i < seqlen; i++)
            {
                float* outptr = outm.row(i);

                for (int j = 0; j < embed_dim_per_head; j++)
                {
                    const float* ptr = q_blob.row(i);
                    const float* kptr = (const float*)q_weight_data + embed_dim * (q * embed_dim_per_head + j);

                    float sum = q_bias_data[q * embed_dim_per_head + j];
                    for (int k = 0; k < embed_dim; k++)
                    {
                        sum += *ptr++ * *kptr++;
                    }

                    outptr[j] = sum * inv_sqrt_embed_dim_per_head;
                }
            }
        }

        // xk = affine(k)
        {
            Mat outm = xk.channel(q);

            for (int i = 0; i < seqlen; i++)
            {
                float* outptr = outm.row(i);

                for (int j = 0; j < embed_dim_per_head; j++)
                {
                    const float* ptr = k_blob.row(i);
                    const float* kptr = (const float*)k_weight_data + embed_dim * (q * embed_dim_per_head + j);

                    float sum = k_bias_data[q * embed_dim_per_head + j];
                    for (int k = 0; k < embed_dim; k++)
                    {
                        sum += *ptr++ * *kptr++;
                    }

                    outptr[j] = sum;
                }
            }
        }

        // xv = affine(v)
        {
            Mat outm = xv.channel(q);

            for (int i = 0; i < embed_dim_per_head; i++)
            {
                for (int j = 0; j < seqlen; j++)
                {
                    const float* ptr = v_blob.row(j);
                    const float* kptr = (const float*)v_weight_data + embed_dim * (q * embed_dim_per_head + i);

                    float sum = v_bias_data[q * embed_dim_per_head + i];
                    for (int k = 0; k < embed_dim; k++)
                    {
                        sum += *ptr++ * *kptr++;
                    }

                    float* outptr = outm.row(i);

                    outptr[j] = sum;
                }
            }
        }

        // xqk = xq * xk
        // xq  (embed_dim_per_head, seqlen)
        // xk  (embed_dim_per_head, seqlen)
        {
            const Mat xqm = xq.channel(q);
            const Mat xkm = xk.channel(q);

            Mat outm = xqk.channel(q);

            for (int i = 0; i < seqlen; i++)
            {
                float* outptr = outm.row(i);

                for (int j = 0; j < seqlen; j++)
                {
                    const float* qptr = xqm.row(i);
                    const float* kptr = xkm.row(j);

                    float sum = 0.f;
                    for (int k = 0; k < embed_dim_per_head; k++)
                    {
                        sum += *qptr++ * *kptr++;
                    }

                    outptr[j] = sum;
                }
            }
        }

        // softmax(xqk)
        {
            Mat outm = xqk.channel(q);

            for (int i = 0; i < seqlen; i++)
            {
                float* ptr = outm.row(i);

                float max = -FLT_MAX;
                for (int j = 0; j < seqlen; j++)
                {
                    max = std::max(max, ptr[j]);
                }

                float sum = 0.f;
                for (int j = 0; j < seqlen; j++)
                {
                    ptr[j] = (float)(exp(ptr[j] - max));
                    sum += ptr[j];
                }

                for (int j = 0; j < seqlen; j++)
                {
                    ptr[j] /= sum;
                }
            }
        }

        // xqkv = xqk * xv
        // xqk (seqlen, seqlen)
        // xv  (seqlen, embed_dim_per_head)
        // out (embed_dim_per_head, num_head, seqlen)
        {
            const Mat xqkm = xqk.channel(q);
            const Mat xvm = xv.channel(q);

            for (int i = 0; i < seqlen; i++)
            {
                float* outptr = xqkv.channel(i).row(q);

                for (int j = 0; j < embed_dim_per_head; j++)
                {
                    const float* qkptr = xqkm.row(i);
                    const float* vptr = xvm.row(j);

                    float sum = 0.f;
                    for (int k = 0; k < seqlen; k++)
                    {
                        sum += *qkptr++ * *vptr++;
                    }

                    outptr[j] = sum;
                }
            }
        }
    }

    // out = affine(xqkv)
    // xqkv  (embed_dim, seqlen)
    #pragma omp parallel for num_threads(opt.num_threads)
    for (int i = 0; i < seqlen; i++)
    {
        float* outptr = top_blob.row(i);

        for (int j = 0; j < embed_dim; j++)
        {
            const float* ptr = xqkv.channel(i);
            const float* kptr = (const float*)out_weight_data + embed_dim * j;

            float sum = out_bias_data[j];
            for (int k = 0; k < embed_dim; k++)
            {
                sum += *ptr++ * *kptr++;
            }

            outptr[j] = sum;
        }
    }

    return 0;
}